

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

void * decrypt_thread(void *pargs)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  uint uVar5;
  uint8_t auStack_8288 [4];
  __uint32_t local_8284;
  __uint64_t _Stack_8280;
  uint32_t exp_padding;
  uint64_t exp_total;
  ssize_t total;
  ssize_t rd;
  uint8_t buffer [32800];
  uint8_t hash [32];
  uint8_t next_iv [16];
  uint8_t iv [16];
  aes_context aes;
  sha256_context tmp;
  sha256_context ctx;
  args_t *args;
  void *pargs_local;
  
  sVar4 = read_block(*pargs,next_iv + 8,0x10);
  if (sVar4 < 0x10) {
    fprintf(_stderr,"file too small! cannot read IV!\n");
  }
  else {
    aes_init_dec((aes_context *)(iv + 8),(uint8_t *)((long)pargs + 8),0x100);
    sha256_init((sha256_context *)(tmp.buffer + 0x38));
    sha256_starts((sha256_context *)(tmp.buffer + 0x38));
    exp_total = 0x10;
    while( true ) {
      total = read_block(*pargs,&rd,0x8020);
      if (total < 1) break;
      uVar1 = *(undefined8 *)((long)&exp_total + total);
      next_iv._0_8_ = *(undefined8 *)((long)&total + total);
      aes_cbc_decrypt((aes_context *)(iv + 8),next_iv + 8,(uint8_t *)&rd,total,(uint8_t *)&rd);
      if (total != 0x8020) {
        exp_total = total + exp_total;
        break;
      }
      sha256_update((sha256_context *)(tmp.buffer + 0x38),(uchar *)&rd,0x8000);
      sha256_copy((sha256_context *)(aes.key + 0x42),(sha256_context *)(tmp.buffer + 0x38));
      sha256_final((sha256_context *)(aes.key + 0x42),buffer + 0x8018);
      iVar3 = memcmp(auStack_8288 + total,buffer + 0x8018,0x20);
      if (iVar3 != 0) {
        fprintf(_stderr,"hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n",
                exp_total + total + -0x20,total);
        print_hash("expected",auStack_8288 + total);
        print_hash("actual",buffer + 0x8018);
        goto LAB_0010295f;
      }
      write_block(*(int *)((long)pargs + 4),&rd,total - 0x20);
      iv[0] = next_iv[0];
      iv[1] = next_iv[1];
      iv[2] = next_iv[2];
      iv[3] = next_iv[3];
      iv[4] = next_iv[4];
      iv[5] = next_iv[5];
      iv[6] = next_iv[6];
      iv[7] = next_iv[7];
      exp_total = total + exp_total;
      next_iv._8_8_ = uVar1;
    }
    if (total < 0) {
      fprintf(_stderr,"Read error occured!\n");
    }
    else {
      local_8284 = __uint32_identity(*(__uint32_t *)((long)&exp_total + total));
      _Stack_8280 = __uint64_identity(*(__uint64_t *)((long)&total + total));
      if (_Stack_8280 == exp_total) {
        uVar2 = local_8284 + 0x10;
        uVar5 = local_8284 + 0x30;
        local_8284 = uVar2;
        if ((long)(ulong)uVar5 <= total) {
          sha256_update((sha256_context *)(tmp.buffer + 0x38),(uchar *)&rd,
                        (total + -0x20) - (ulong)uVar2);
          memcpy(aes.key + 0x42,tmp.buffer + 0x38,0x68);
          sha256_final((sha256_context *)(aes.key + 0x42),buffer + 0x8018);
          iVar3 = memcmp(auStack_8288 + (total - (ulong)local_8284),buffer + 0x8018,0x20);
          if (iVar3 == 0) {
            write_block(*(int *)((long)pargs + 4),&rd,(total + -0x20) - (ulong)local_8284);
          }
          else {
            fprintf(_stderr,"hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n",
                    (exp_total + total + -0x20) - (ulong)local_8284,total);
            print_hash("expected",auStack_8288 + total);
            print_hash("actual",buffer + 0x8018);
          }
        }
      }
      else {
        fprintf(_stderr,"read size mismatch. expected: 0x%llx, actual: 0x%zx\n",_Stack_8280,
                exp_total);
      }
    }
  }
LAB_0010295f:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *decrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t next_iv[AES_BLOCK_SIZE];
  uint8_t hash[SHA256_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE];
  ssize_t rd, total;

  // read iv
  if (read_block(args->in, iv, AES_BLOCK_SIZE) < AES_BLOCK_SIZE) {
    fprintf(stderr, "file too small! cannot read IV!\n");
    goto end;
  }

  // decrypt blocks
  aes_init_dec(&aes, args->key, 256);
  sha256_init(&ctx);
  sha256_starts(&ctx);
  total = AES_BLOCK_SIZE;
  while ((rd = read_block(args->in, buffer, sizeof(buffer))) > 0) {
    // save next iv
    memcpy(next_iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // decrypt
    aes_cbc_decrypt(&aes, iv, buffer, rd, buffer);

    if (rd != sizeof(buffer)) {
      total += rd;
      break; // last block requires special processing
    }

    // TODO: there's actually a bug in Sony's implementation where 
    // if the last block is exactly 0x8000 (before the SHA256) then 
    // it won't know about the last block and terminate in error. 
    // In other words, we don't have to handle this edge case... for now.

    // validate hash
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }

    // write output
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE);

    memcpy(iv, next_iv, AES_BLOCK_SIZE);
    total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // handle last block specially
  uint64_t exp_total;
  uint32_t exp_padding;

  exp_padding = le32toh(*(uint32_t *)&buffer[rd-0x10]);
  exp_total = le64toh(*(uint64_t *)&buffer[rd-0x8]);
  if (exp_total != total) {
    fprintf(stderr, "read size mismatch. expected: 0x%llx, actual: 0x%zx\n", exp_total, total);
    goto end;
  }
  exp_padding += 0x10;
  if (rd >= SHA256_BLOCK_SIZE + exp_padding) {
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
    tmp = ctx;
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE-exp_padding], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE - exp_padding, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
  }

end:
  close(args->out);
  close(args->in);
  return NULL;
}